

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O0

void __thiscall
ParamListStandard::forceInactiveChain
          (ParamListStandard *this,ParamActive *active,int4 maxchain,int4 start,int4 stop)

{
  bool bVar1;
  bool bVar2;
  spacetype sVar3;
  type_metatype tVar4;
  int iVar5;
  int4 iVar6;
  int4 iVar7;
  ParamTrial *pPVar8;
  ParamEntry *pPVar9;
  Address *this_00;
  AddrSpace *this_01;
  ParamTrial *pPVar10;
  ParamTrial *trial_1;
  int4 i_1;
  ParamTrial *trial;
  int local_30;
  int4 i;
  int4 max;
  int4 chainlength;
  bool seenchain;
  int4 stop_local;
  int4 start_local;
  int4 maxchain_local;
  ParamActive *active_local;
  ParamListStandard *this_local;
  
  bVar2 = false;
  i = 0;
  local_30 = -1;
  for (trial._4_4_ = start; trial_1._4_4_ = start, trial._4_4_ < stop; trial._4_4_ = trial._4_4_ + 1
      ) {
    pPVar8 = ParamActive::getTrial(active,trial._4_4_);
    pPVar9 = ParamTrial::getEntry(pPVar8);
    if (pPVar9 != (ParamEntry *)0x0) {
      bVar1 = ParamTrial::isActive(pPVar8);
      if (bVar1) {
        i = 0;
        if (!bVar2) {
          local_30 = trial._4_4_;
        }
      }
      else {
        bVar1 = ParamTrial::isUnref(pPVar8);
        if ((bVar1) && (bVar1 = ParamActive::isRecoverSubcall(active), bVar1)) {
          this_00 = ParamTrial::getAddress(pPVar8);
          this_01 = Address::getSpace(this_00);
          sVar3 = AddrSpace::getType(this_01);
          if (sVar3 == IPTR_SPACEBASE) {
            bVar2 = true;
          }
        }
        if (trial._4_4_ == start) {
          pPVar9 = ParamTrial::getEntry(pPVar8);
          tVar4 = ParamEntry::getType(pPVar9);
          if (tVar4 == TYPE_FLOAT) {
            pPVar10 = ParamActive::getTrial(active,0);
            iVar5 = ParamTrial::slotGroup(pPVar10);
          }
          else {
            iVar6 = ParamTrial::slotGroup(pPVar8);
            iVar5 = iVar6 - this->nonfloatgroup;
          }
          iVar5 = iVar5 + 1;
        }
        else {
          iVar6 = ParamTrial::slotGroup(pPVar8);
          pPVar10 = ParamActive::getTrial(active,trial._4_4_ + -1);
          iVar7 = ParamTrial::slotGroup(pPVar10);
          iVar5 = iVar6 - iVar7;
        }
        i = iVar5 + i;
        if (maxchain < i) {
          bVar2 = true;
        }
      }
      if (bVar2) {
        ParamTrial::markInactive(pPVar8);
      }
    }
  }
  for (; trial_1._4_4_ <= local_30; trial_1._4_4_ = trial_1._4_4_ + 1) {
    pPVar8 = ParamActive::getTrial(active,trial_1._4_4_);
    bVar2 = ParamTrial::isDefinitelyNotUsed(pPVar8);
    if ((!bVar2) && (bVar2 = ParamTrial::isActive(pPVar8), !bVar2)) {
      ParamTrial::markActive(pPVar8);
    }
  }
  return;
}

Assistant:

void ParamListStandard::forceInactiveChain(ParamActive *active,int4 maxchain,int4 start,int4 stop) const

{
  bool seenchain = false;
  int4 chainlength = 0;
  int4 max = -1;
  for(int4 i=start;i<stop;++i) {
    ParamTrial &trial(active->getTrial(i));
    if (trial.getEntry() == (const ParamEntry *)0) continue; // Already know not used
    if (!trial.isActive()) {
      if (trial.isUnref()&&active->isRecoverSubcall()) {
	// If there is no reference to the trial within the function, the only real possibility
	// is that a register is an input to the calling function and it is being reused (immediately)
	// to pass the input into the called function.  This really can't happen on the stack because
	// the stack relative caller offset and callee offset are different
	if (trial.getAddress().getSpace()->getType() == IPTR_SPACEBASE) // So if the parameter is on the stack
	  seenchain = true;	// Mark that we have already seen an inactive chain
      }
      if (i==start) {
	if (trial.getEntry()->getType() == TYPE_FLOAT)
	  chainlength += (active->getTrial(0).slotGroup()+1);
	else
	  chainlength += (trial.slotGroup() - nonfloatgroup + 1);
      }
      else
	chainlength += trial.slotGroup() - active->getTrial(i-1).slotGroup();
      if (chainlength > maxchain)
	seenchain = true;
    }
    else {
      chainlength = 0;
      if (!seenchain)
	max = i;
    }
    if (seenchain)
      trial.markInactive();
  }
  for(int4 i=start;i<=max;++i) { // Across the range of active trials, fill in "holes" of inactive trials
    ParamTrial &trial(active->getTrial(i));
    if (trial.isDefinitelyNotUsed()) continue;
    if (!trial.isActive())
      trial.markActive();
  }
}